

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

int __thiscall QAbstractItemView::sizeHintForColumn(QAbstractItemView *this,int column)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  QAbstractItemViewPrivate *this_01;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  QObject *pQVar4;
  int iVar5;
  int iVar6;
  QEditorInfo *pQVar7;
  long *plVar8;
  int iVar9;
  long in_FS_OFFSET;
  int local_154;
  QModelIndex local_140;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column) {
    this_01 = *(QAbstractItemViewPrivate **)(this + 8);
    pQVar2 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,this_00);
    iVar5 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&option);
    if (column < iVar5) {
      QWidget::ensurePolished((QWidget *)this);
      memset(&option,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&option);
      (**(code **)(*(long *)this + 0x2f8))(this,&option);
      pQVar2 = this_01->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_128,this_00);
      iVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_128);
      local_154 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (iVar9 = 0; iVar5 != iVar9; iVar9 = iVar9 + 1) {
        local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar2 = this_01->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
        (**(code **)(*(long *)pQVar2 + 0x60))
                  ((QModelIndex *)&local_128,pQVar2,iVar9,column,&local_140);
        pQVar7 = QAbstractItemViewPrivate::editorForIndex(this_01,(QModelIndex *)&local_128);
        pDVar3 = (pQVar7->widget).wp.d;
        iVar6 = local_154;
        if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
            (pQVar4 = (pQVar7->widget).wp.value, pQVar4 != (QObject *)0x0)) &&
           (iVar6 = (**(code **)(*(long *)pQVar4 + 0x70))(), iVar6 < local_154)) {
          iVar6 = local_154;
        }
        local_154 = iVar6;
        plVar8 = (long *)(**(code **)(*(long *)this + 0x208))(this,(QModelIndex *)&local_128);
        if ((plVar8 != (long *)0x0) &&
           (iVar6 = (**(code **)(*plVar8 + 0x68))(plVar8,&option,(QModelIndex *)&local_128),
           local_154 <= iVar6)) {
          local_154 = iVar6;
        }
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(&option);
      goto LAB_004e7d8e;
    }
  }
  local_154 = -1;
LAB_004e7d8e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_154;
}

Assistant:

int QAbstractItemView::sizeHintForColumn(int column) const
{
    Q_D(const QAbstractItemView);

    if (column < 0 || column >= d->model->columnCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int width = 0;
    int rows = d->model->rowCount(d->root);
    for (int r = 0; r < rows; ++r) {
        const QModelIndex index = d->model->index(r, column, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            width = qMax(width, editor->sizeHint().width());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            width = qMax(width, delegate->sizeHint(option, index).width());
    }
    return width;
}